

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * Mul_QV(QMatrix *Q,Vector *V)

{
  ulong Dim_00;
  size_t *psVar1;
  ElType **ppEVar2;
  ElType **ppEVar3;
  Real *pRVar4;
  Real *pRVar5;
  size_t *psVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  LASErrIdType LVar17;
  char *pcVar18;
  size_t sVar19;
  size_t sVar20;
  char *pcVar21;
  char *pcVar22;
  ElType *pEVar23;
  bool bVar24;
  bool bVar25;
  Real *VResCmp;
  Real *VCmp;
  ElType *PtrEl;
  ElType **QDiagEl;
  ElType **QEl;
  Boolean MultiplDULVEquals;
  Boolean MultiplLVIsOne;
  Boolean MultiplUVIsOne;
  Boolean MultiplDVIsOne;
  Boolean MultiplLVIsZero;
  Boolean MultiplUVIsZero;
  Boolean MultiplDVIsZero;
  size_t *QLen;
  size_t ElCount;
  size_t Len;
  size_t RoC;
  size_t Clm;
  size_t Row;
  size_t Dim;
  double PartCmp;
  double Cmp;
  double PartSum;
  double Sum;
  double MultiplLV;
  double MultiplUV;
  double MultiplDV;
  char *VResName;
  Vector *VRes;
  Vector *V_local;
  QMatrix *Q_local;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar17 = LASResult();
  if (LVar17 == LASOK) {
    if (Q->Dim == V->Dim) {
      Dim_00 = V->Dim;
      VResName = (char *)malloc(0x30);
      pcVar18 = Q_GetName(Q);
      sVar19 = strlen(pcVar18);
      pcVar18 = V_GetName(V);
      sVar20 = strlen(pcVar18);
      pcVar18 = (char *)malloc(sVar19 + sVar20 + 10);
      if (((Vector *)VResName == (Vector *)0x0) || (pcVar18 == (char *)0x0)) {
        pcVar21 = Q_GetName(Q);
        pcVar22 = V_GetName(V);
        LASError(LASMemAllocErr,"Mul_QV",pcVar21,pcVar22,(char *)0x0);
        if ((Vector *)VResName != (Vector *)0x0) {
          free(VResName);
        }
      }
      else {
        pcVar21 = Q_GetName(Q);
        pcVar22 = V_GetName(V);
        sprintf(pcVar18,"(%s) * (%s)",pcVar21,pcVar22);
        V_Constr((Vector *)VResName,pcVar18,Dim_00,Tempor,True);
        Q_SortEl(Q);
        Q_AllocInvDiagEl(Q);
        LVar17 = LASResult();
        if ((LVar17 == LASOK) && (Q->ElSorted != (Boolean *)0x0)) {
          psVar1 = Q->Len;
          ppEVar2 = Q->El;
          ppEVar3 = Q->DiagEl;
          pRVar4 = V->Cmp;
          pRVar5 = ((Vector *)VResName)->Cmp;
          if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
            V_SetAllCmp((Vector *)VResName,0.0);
          }
          dVar7 = Q->MultiplD * V->Multipl;
          dVar8 = Q->MultiplU * V->Multipl;
          dVar9 = Q->MultiplL * V->Multipl;
          bVar11 = 2.2250738585072014e-307 <= ABS(dVar7);
          bVar12 = 2.2250738585072014e-307 <= ABS(dVar8);
          bVar13 = 2.2250738585072014e-307 <= ABS(dVar9);
          bVar14 = ABS(dVar7 - 1.0) < 2.220446049250313e-15;
          bVar15 = 2.220446049250313e-15 <= ABS(dVar8 - 1.0);
          bVar25 = 2.220446049250313e-15 <= ABS(dVar9 - 1.0);
          if (((ABS(dVar7) < 2.2250738585072014e-307) ||
              (2.220446049250313e-15 <= ABS(dVar8 / dVar7 - 1.0))) ||
             (2.220446049250313e-15 <= ABS(dVar9 / dVar7 - 1.0))) {
            bVar16 = false;
          }
          else {
            bVar16 = true;
          }
          if (Q->Symmetry != False) {
            if (bVar16) {
              for (Len = 1; Len <= Dim_00; Len = Len + 1) {
                QLen = (size_t *)psVar1[Len];
                VCmp = (Real *)ppEVar2[Len];
                PartSum = 0.0;
                if (bVar14) {
                  PartCmp = pRVar4[Len];
                }
                else {
                  PartCmp = dVar7 * pRVar4[Len];
                }
                for (; QLen != (size_t *)0x0; QLen = (size_t *)((long)QLen + -1)) {
                  if (*VCmp != (Real)Len) {
                    pRVar5[(long)*VCmp] = VCmp[1] * PartCmp + pRVar5[(long)*VCmp];
                    PartSum = VCmp[1] * pRVar4[(long)*VCmp] + PartSum;
                  }
                  VCmp = VCmp + 2;
                }
                dVar10 = ppEVar3[Len]->Val * pRVar4[Len] + PartSum;
                if (bVar14) {
                  pRVar5[Len] = dVar10 + pRVar5[Len];
                }
                else {
                  pRVar5[Len] = dVar7 * dVar10 + pRVar5[Len];
                }
              }
            }
            else {
              for (Len = 1; Len <= Dim_00; Len = Len + 1) {
                psVar6 = (size_t *)psVar1[Len];
                PartSum = 0.0;
                if (((bVar12) && (Q->ElOrder == Rowws)) || ((bVar13 && (Q->ElOrder == Clmws)))) {
                  VCmp = (Real *)ppEVar2[Len];
                  for (QLen = psVar6; QLen != (size_t *)0x0; QLen = (size_t *)((long)QLen + -1)) {
                    if (*VCmp != (Real)Len) {
                      PartSum = VCmp[1] * pRVar4[(long)*VCmp] + PartSum;
                    }
                    VCmp = VCmp + 2;
                  }
                  if ((bVar12) && (bVar15)) {
                    PartSum = dVar8 * PartSum;
                  }
                  if ((bVar13) && (bVar25)) {
                    PartSum = dVar9 * PartSum;
                  }
                }
                if (bVar11) {
                  if (bVar14) {
                    dVar10 = ppEVar3[Len]->Val * pRVar4[Len];
                  }
                  else {
                    dVar10 = dVar7 * ppEVar3[Len]->Val * pRVar4[Len];
                  }
                  PartSum = dVar10 + PartSum;
                }
                pRVar5[Len] = PartSum + pRVar5[Len];
                if (((bVar12) && (Q->ElOrder == Clmws)) || ((bVar13 && (Q->ElOrder == Rowws)))) {
                  PartCmp = pRVar4[Len];
                  if ((bVar12) && (bVar15)) {
                    PartCmp = dVar8 * PartCmp;
                  }
                  if ((bVar13) && (bVar25)) {
                    PartCmp = dVar9 * PartCmp;
                  }
                  VCmp = (Real *)ppEVar2[Len];
                  for (QLen = psVar6; QLen != (size_t *)0x0; QLen = (size_t *)((long)QLen + -1)) {
                    if (*VCmp != (Real)Len) {
                      pRVar5[(long)*VCmp] = VCmp[1] * PartCmp + pRVar5[(long)*VCmp];
                    }
                    VCmp = VCmp + 2;
                  }
                }
              }
            }
          }
          if ((Q->Symmetry == False) && (Q->ElOrder == Rowws)) {
            if (bVar16) {
              for (Clm = 1; Clm <= Dim_00; Clm = Clm + 1) {
                QLen = (size_t *)psVar1[Clm];
                VCmp = (Real *)ppEVar2[Clm];
                PartSum = 0.0;
                for (; QLen != (size_t *)0x0; QLen = (size_t *)((long)QLen + -1)) {
                  PartSum = VCmp[1] * pRVar4[(long)*VCmp] + PartSum;
                  VCmp = VCmp + 2;
                }
                if (bVar14) {
                  pRVar5[Clm] = PartSum;
                }
                else {
                  pRVar5[Clm] = dVar7 * PartSum;
                }
              }
            }
            else {
              for (Clm = 1; Clm <= Dim_00; Clm = Clm + 1) {
                psVar6 = (size_t *)psVar1[Clm];
                PartSum = 0.0;
                if (bVar13) {
                  VCmp = (Real *)ppEVar2[Clm];
                  Cmp = 0.0;
                  QLen = psVar6;
                  while( true ) {
                    bVar24 = false;
                    if (QLen != (size_t *)0x0) {
                      bVar24 = (ulong)*VCmp < Clm;
                    }
                    if (!bVar24) break;
                    Cmp = VCmp[1] * pRVar4[(long)*VCmp] + Cmp;
                    VCmp = VCmp + 2;
                    QLen = (size_t *)((long)QLen + -1);
                  }
                  if (bVar25) {
                    Cmp = dVar9 * Cmp;
                  }
                  PartSum = Cmp + 0.0;
                }
                if (bVar11) {
                  if (bVar14) {
                    dVar10 = ppEVar3[Clm]->Val * pRVar4[Clm];
                  }
                  else {
                    dVar10 = dVar7 * ppEVar3[Clm]->Val * pRVar4[Clm];
                  }
                  PartSum = dVar10 + PartSum;
                }
                if (bVar12) {
                  Cmp = 0.0;
                  QLen = psVar6;
                  pEVar23 = ppEVar2[Clm] + (long)psVar6;
                  while( true ) {
                    VCmp = (Real *)(pEVar23 + -1);
                    bVar24 = false;
                    if (QLen != (size_t *)0x0) {
                      bVar24 = Clm < (ulong)*VCmp;
                    }
                    if (!bVar24) break;
                    Cmp = pEVar23[-1].Val * pRVar4[(long)*VCmp] + Cmp;
                    QLen = (size_t *)((long)QLen + -1);
                    pEVar23 = (ElType *)VCmp;
                  }
                  if (bVar15) {
                    Cmp = dVar8 * Cmp;
                  }
                  PartSum = Cmp + PartSum;
                }
                pRVar5[Clm] = PartSum;
              }
            }
          }
          if ((Q->Symmetry == False) && (Q->ElOrder == Clmws)) {
            if (bVar16) {
              for (RoC = 1; RoC <= Dim_00; RoC = RoC + 1) {
                QLen = (size_t *)psVar1[RoC];
                VCmp = (Real *)ppEVar2[RoC];
                if (bVar14) {
                  PartCmp = pRVar4[RoC];
                }
                else {
                  PartCmp = dVar7 * pRVar4[RoC];
                }
                for (; QLen != (size_t *)0x0; QLen = (size_t *)((long)QLen + -1)) {
                  pRVar5[(long)*VCmp] = VCmp[1] * PartCmp + pRVar5[(long)*VCmp];
                  VCmp = VCmp + 2;
                }
              }
            }
            else {
              for (RoC = 1; RoC <= Dim_00; RoC = RoC + 1) {
                psVar6 = (size_t *)psVar1[RoC];
                dVar9 = pRVar4[RoC];
                QLen = psVar6;
                if (bVar12) {
                  VCmp = (Real *)ppEVar2[RoC];
                  Dim = (size_t)dVar9;
                  if (bVar15) {
                    Dim = (size_t)(dVar8 * dVar9);
                  }
                  while( true ) {
                    bVar25 = false;
                    if (QLen != (size_t *)0x0) {
                      bVar25 = (ulong)*VCmp < RoC;
                    }
                    if (!bVar25) break;
                    pRVar5[(long)*VCmp] = VCmp[1] * (double)Dim + pRVar5[(long)*VCmp];
                    VCmp = VCmp + 2;
                    QLen = (size_t *)((long)QLen + -1);
                  }
                }
                if (bVar11) {
                  if (bVar14) {
                    pRVar5[RoC] = ppEVar3[RoC]->Val * dVar9 + pRVar5[RoC];
                  }
                  else {
                    pRVar5[RoC] = dVar7 * ppEVar3[RoC]->Val * dVar9 + pRVar5[RoC];
                  }
                }
                if (bVar13) {
                  pEVar23 = ppEVar2[RoC] + (long)psVar6;
                  QLen = psVar6;
                  while( true ) {
                    VCmp = (Real *)(pEVar23 + -1);
                    bVar25 = false;
                    if (QLen != (size_t *)0x0) {
                      bVar25 = RoC < (ulong)*VCmp;
                    }
                    if (!bVar25) break;
                    pRVar5[(long)*VCmp] = pEVar23[-1].Val * dVar9 + pRVar5[(long)*VCmp];
                    QLen = (size_t *)((long)QLen + -1);
                    pEVar23 = (ElType *)VCmp;
                  }
                }
              }
            }
          }
        }
        else {
          LVar17 = LASResult();
          if ((LVar17 == LASOK) && (*Q->ElSorted == False)) {
            pcVar21 = Q_GetName(Q);
            pcVar22 = V_GetName(V);
            LASError(LASElNotSortedErr,"Mul_QV",pcVar21,pcVar22,(char *)0x0);
          }
        }
      }
      if (pcVar18 != (char *)0x0) {
        free(pcVar18);
      }
    }
    else {
      pcVar18 = Q_GetName(Q);
      pcVar21 = V_GetName(V);
      LASError(LASDimErr,"Mul_QV",pcVar18,pcVar21,(char *)0x0);
      VResName = (char *)0x0;
    }
  }
  else {
    VResName = (char *)0x0;
  }
  Q_Unlock(Q);
  V_Unlock(V);
  return (Vector *)VResName;
}

Assistant:

Vector *Mul_QV(QMatrix *Q, Vector *V)
/* VRes = Q * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplDV, MultiplUV, MultiplLV;
    double Sum, PartSum, Cmp, PartCmp;
    size_t Dim, Row, Clm, RoC, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDVIsZero, MultiplUVIsZero, MultiplLVIsZero;
    Boolean MultiplDVIsOne, MultiplUVIsOne, MultiplLVIsOne;
    Boolean MultiplDULVEquals;
    ElType **QEl, **QDiagEl, *PtrEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                
                /* sort of elements and allocation of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && Q->ElSorted) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QDiagEl = Q->DiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplDV = Q->MultiplD * V->Multipl;
                    MultiplUV = Q->MultiplU * V->Multipl;
                    MultiplLV = Q->MultiplL * V->Multipl;
                    MultiplDVIsZero = IsZero(MultiplDV);
                    MultiplUVIsZero = IsZero(MultiplUV);
                    MultiplLVIsZero = IsZero(MultiplLV);
                    MultiplDVIsOne = IsOne(MultiplDV);
                    MultiplUVIsOne = IsOne(MultiplUV);
                    MultiplLVIsOne = IsOne(MultiplLV);
                    if (!IsZero(MultiplDV) && IsOne(MultiplUV / MultiplDV)
                        && IsOne(MultiplLV / MultiplDV)) {
                        MultiplDULVEquals = True;
                    } else {
                        MultiplDULVEquals = False;
                    }

                    /* multiplication of the lower, diagonal and upper part
                       of the matrix Q by the vector V */
                    if (Q->Symmetry) {
                        if (MultiplDULVEquals) {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                PtrEl = QEl[RoC];
                                   Sum = 0.0;
                                if (!MultiplDVIsOne)
                                    Cmp = MultiplDV * VCmp[RoC];
                                else
                                       Cmp = VCmp[RoC];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    if ((*PtrEl).Pos != RoC) {
                                        VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    }
                                    PtrEl++;
                                }
                                Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                if (MultiplDVIsOne)
                                    VResCmp[RoC] += Sum;
                                else
                                    VResCmp[RoC] += MultiplDV * Sum;
                                  }
                        } else {
                            for (RoC = 1; RoC <= Dim; RoC++) {
                                Len = QLen[RoC];
                                   Sum = 0.0;
                                if ((!MultiplUVIsZero && Q->ElOrder == Rowws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Clmws)) {
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC) {
                                            Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        }
                                        PtrEl++;
                                    }
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                           Sum = MultiplUV * Sum;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                           Sum = MultiplLV * Sum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne) {
                                        Sum += (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                    else { // changed
                                        Sum += MultiplDV * (*QDiagEl[RoC]).Val * VCmp[RoC];
                                    }
                                }
                                VResCmp[RoC] += Sum;
                                if ((!MultiplUVIsZero && Q->ElOrder == Clmws)
                                    || (!MultiplLVIsZero && Q->ElOrder == Rowws)) {
                                      Cmp = VCmp[RoC];
                                    if (!MultiplUVIsZero && !MultiplUVIsOne)
                                         Cmp *= MultiplUV;
                                    if (!MultiplLVIsZero && !MultiplLVIsOne)
                                             Cmp *= MultiplLV;
                                    PtrEl = QEl[RoC];
                                        for (ElCount = Len; ElCount > 0; ElCount--) {
                                        if ((*PtrEl).Pos != RoC)
                                             VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl++;
                                    }
                                }
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Rowws) {
                        if (MultiplDULVEquals) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                    Sum = 0.0;
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (MultiplDVIsOne)
                                    VResCmp[Row] = Sum;
                                else
                                    VResCmp[Row] = MultiplDV * Sum;
                              }
                          } else {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                Sum = 0.0;
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Row];
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl++;
                                    }
                                    if (MultiplLVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplLV * PartSum;
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                        Sum += (*QDiagEl[Row]).Val * VCmp[Row];
                                    else
                                        Sum += MultiplDV * (*QDiagEl[Row]).Val * VCmp[Row];
                                }
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Row] + Len - 1;
                                        PartSum = 0.0;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                        ElCount--) {
                                        PartSum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                        PtrEl--;
                                    }
                                    if (MultiplUVIsOne)
                                        Sum += PartSum;
                                    else
                                        Sum += MultiplUV * PartSum;
                                }
                                VResCmp[Row] = Sum;
                              }
                        }
                    }
                    if (!Q->Symmetry && Q->ElOrder == Clmws) {
                        if (MultiplDULVEquals) {
                             for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                if (MultiplDVIsOne)
                                       Cmp = VCmp[Clm];
                                else
                                    Cmp = MultiplDV * VCmp[Clm];
                                for (ElCount = Len; ElCount > 0; ElCount--) {
                                    VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                          } else {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Len = QLen[Clm];
                                Cmp = VCmp[Clm];
                                if (!MultiplUVIsZero) {
                                    PtrEl = QEl[Clm];
                                    if (MultiplUVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplUV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * PartCmp;
                                        PtrEl++;
                                    }
                                }
                                if (!MultiplDVIsZero) {
                                    if (MultiplDVIsOne)
                                         VResCmp[Clm] += (*QDiagEl[Clm]).Val * Cmp;
                                    else
                                         VResCmp[Clm] += MultiplDV * (*QDiagEl[Clm]).Val * Cmp;
                                }
                                if (!MultiplLVIsZero) {
                                    PtrEl = QEl[Clm] + Len - 1;
                                    if (MultiplLVIsOne)
                                        PartCmp = Cmp;
                                    else
                                        PartCmp = MultiplLV * Cmp;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                        ElCount--) {
                                         VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                        PtrEl--;
                                    }
                                }
                              }
                        }
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}